

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase48::run(TestCase48 *this)

{
  bool bVar1;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  HttpMethod local_3c;
  Array<char> local_38;
  StringPtr local_20;
  
  local_3c = GET;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "GET";
  local_20.content.size_ = 4;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::GET) == \\\"GET\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::GET) == \"GET\"");
  }
  name.content.size_ = 4;
  name.content.ptr = "GET";
  tryParseHttpMethod((kj *)&local_38,name);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::GET\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::GET");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"GET\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"GET\" as HttpMethod");
  }
  local_3c = HEAD;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "HEAD";
  local_20.content.size_ = 5;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::HEAD) == \\\"HEAD\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::HEAD) == \"HEAD\"");
  }
  name_00.content.size_ = 5;
  name_00.content.ptr = "HEAD";
  tryParseHttpMethod((kj *)&local_38,name_00);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 1) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::HEAD\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::HEAD");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"HEAD\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"HEAD\" as HttpMethod");
  }
  local_3c = POST;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "POST";
  local_20.content.size_ = 5;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::POST) == \\\"POST\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::POST) == \"POST\"");
  }
  name_01.content.size_ = 5;
  name_01.content.ptr = "POST";
  tryParseHttpMethod((kj *)&local_38,name_01);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 2) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::POST\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::POST");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"POST\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"POST\" as HttpMethod");
  }
  local_3c = PUT;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "PUT";
  local_20.content.size_ = 4;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PUT) == \\\"PUT\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::PUT) == \"PUT\"");
  }
  name_02.content.size_ = 4;
  name_02.content.ptr = "PUT";
  tryParseHttpMethod((kj *)&local_38,name_02);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 3) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PUT\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::PUT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PUT\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"PUT\" as HttpMethod");
  }
  local_3c = DELETE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "DELETE";
  local_20.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::DELETE) == \\\"DELETE\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::DELETE) == \"DELETE\"");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "DELETE";
  tryParseHttpMethod((kj *)&local_38,name_03);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 4) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::DELETE\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::DELETE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"DELETE\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"DELETE\" as HttpMethod");
  }
  local_3c = PATCH;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "PATCH";
  local_20.content.size_ = 6;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PATCH) == \\\"PATCH\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::PATCH) == \"PATCH\"");
  }
  name_04.content.size_ = 6;
  name_04.content.ptr = "PATCH";
  tryParseHttpMethod((kj *)&local_38,name_04);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 5) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PATCH\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::PATCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PATCH\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"PATCH\" as HttpMethod");
  }
  local_3c = PURGE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "PURGE";
  local_20.content.size_ = 6;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::PURGE) == \\\"PURGE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::PURGE) == \"PURGE\"");
  }
  name_05.content.size_ = 6;
  name_05.content.ptr = "PURGE";
  tryParseHttpMethod((kj *)&local_38,name_05);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 6) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PURGE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::PURGE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PURGE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"PURGE\" as HttpMethod");
  }
  local_3c = OPTIONS;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "OPTIONS";
  local_20.content.size_ = 8;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::OPTIONS) == \\\"OPTIONS\\\"\"",
               (char (*) [59])"failed: expected kj::str(HttpMethod::OPTIONS) == \"OPTIONS\"");
  }
  name_06.content.size_ = 8;
  name_06.content.ptr = "OPTIONS";
  tryParseHttpMethod((kj *)&local_38,name_06);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 7) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::OPTIONS\"",
                 (char (*) [48])"failed: expected *parsed == HttpMethod::OPTIONS");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"OPTIONS\" \"\\\" as HttpMethod\"",
               (char (*) [39])"couldn\'t parse \"OPTIONS\" as HttpMethod");
  }
  local_3c = TRACE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "TRACE";
  local_20.content.size_ = 6;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::TRACE) == \\\"TRACE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::TRACE) == \"TRACE\"");
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "TRACE";
  tryParseHttpMethod((kj *)&local_38,name_07);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 8) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::TRACE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::TRACE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"TRACE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"TRACE\" as HttpMethod");
  }
  local_3c = COPY;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "COPY";
  local_20.content.size_ = 5;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::COPY) == \\\"COPY\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::COPY) == \"COPY\"");
  }
  name_08.content.size_ = 5;
  name_08.content.ptr = "COPY";
  tryParseHttpMethod((kj *)&local_38,name_08);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 9) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::COPY\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::COPY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"COPY\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"COPY\" as HttpMethod");
  }
  local_3c = LOCK;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "LOCK";
  local_20.content.size_ = 5;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::LOCK) == \\\"LOCK\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::LOCK) == \"LOCK\"");
  }
  name_09.content.size_ = 5;
  name_09.content.ptr = "LOCK";
  tryParseHttpMethod((kj *)&local_38,name_09);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 10) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::LOCK\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::LOCK");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"LOCK\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"LOCK\" as HttpMethod");
  }
  local_3c = MKCOL;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "MKCOL";
  local_20.content.size_ = 6;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MKCOL) == \\\"MKCOL\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::MKCOL) == \"MKCOL\"");
  }
  name_10.content.size_ = 6;
  name_10.content.ptr = "MKCOL";
  tryParseHttpMethod((kj *)&local_38,name_10);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0xb) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKCOL\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::MKCOL");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKCOL\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"MKCOL\" as HttpMethod");
  }
  local_3c = MOVE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "MOVE";
  local_20.content.size_ = 5;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MOVE) == \\\"MOVE\\\"\"",
               (char (*) [53])"failed: expected kj::str(HttpMethod::MOVE) == \"MOVE\"");
  }
  name_11.content.size_ = 5;
  name_11.content.ptr = "MOVE";
  tryParseHttpMethod((kj *)&local_38,name_11);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MOVE\"",
                 (char (*) [45])"failed: expected *parsed == HttpMethod::MOVE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MOVE\" \"\\\" as HttpMethod\"",
               (char (*) [36])"couldn\'t parse \"MOVE\" as HttpMethod");
  }
  local_3c = PROPFIND;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "PROPFIND";
  local_20.content.size_ = 9;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::PROPFIND) == \\\"PROPFIND\\\"\"",
               (char (*) [61])"failed: expected kj::str(HttpMethod::PROPFIND) == \"PROPFIND\"");
  }
  name_12.content.size_ = 9;
  name_12.content.ptr = "PROPFIND";
  tryParseHttpMethod((kj *)&local_38,name_12);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0xd) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPFIND\"",
                 (char (*) [49])"failed: expected *parsed == HttpMethod::PROPFIND");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPFIND\" \"\\\" as HttpMethod\"",
               (char (*) [40])"couldn\'t parse \"PROPFIND\" as HttpMethod");
  }
  local_3c = PROPPATCH;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "PROPPATCH";
  local_20.content.size_ = 10;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::PROPPATCH) == \\\"PROPPATCH\\\"\"",
               (char (*) [63])"failed: expected kj::str(HttpMethod::PROPPATCH) == \"PROPPATCH\"");
  }
  name_13.content.size_ = 10;
  name_13.content.ptr = "PROPPATCH";
  tryParseHttpMethod((kj *)&local_38,name_13);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0xe) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::PROPPATCH\"",
                 (char (*) [50])"failed: expected *parsed == HttpMethod::PROPPATCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"PROPPATCH\" \"\\\" as HttpMethod\"",
               (char (*) [41])"couldn\'t parse \"PROPPATCH\" as HttpMethod");
  }
  local_3c = SEARCH;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "SEARCH";
  local_20.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::SEARCH) == \\\"SEARCH\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::SEARCH) == \"SEARCH\"");
  }
  name_14.content.size_ = 7;
  name_14.content.ptr = "SEARCH";
  tryParseHttpMethod((kj *)&local_38,name_14);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0xf) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SEARCH\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::SEARCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SEARCH\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"SEARCH\" as HttpMethod");
  }
  local_3c = UNLOCK;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "UNLOCK";
  local_20.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::UNLOCK) == \\\"UNLOCK\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::UNLOCK) == \"UNLOCK\"");
  }
  name_15.content.size_ = 7;
  name_15.content.ptr = "UNLOCK";
  tryParseHttpMethod((kj *)&local_38,name_15);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x10) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNLOCK\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::UNLOCK");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNLOCK\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"UNLOCK\" as HttpMethod");
  }
  local_3c = ACL;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "ACL";
  local_20.content.size_ = 4;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::ACL) == \\\"ACL\\\"\"",
               (char (*) [51])"failed: expected kj::str(HttpMethod::ACL) == \"ACL\"");
  }
  name_16.content.size_ = 4;
  name_16.content.ptr = "ACL";
  tryParseHttpMethod((kj *)&local_38,name_16);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x11) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::ACL\"",
                 (char (*) [44])"failed: expected *parsed == HttpMethod::ACL");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"ACL\" \"\\\" as HttpMethod\"",
               (char (*) [35])"couldn\'t parse \"ACL\" as HttpMethod");
  }
  local_3c = REPORT;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "REPORT";
  local_20.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::REPORT) == \\\"REPORT\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::REPORT) == \"REPORT\"");
  }
  name_17.content.size_ = 7;
  name_17.content.ptr = "REPORT";
  tryParseHttpMethod((kj *)&local_38,name_17);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x12) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::REPORT\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::REPORT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"REPORT\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"REPORT\" as HttpMethod");
  }
  local_3c = MKACTIVITY;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "MKACTIVITY";
  local_20.content.size_ = 0xb;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::MKACTIVITY) == \\\"MKACTIVITY\\\"\"",
               (char (*) [65])"failed: expected kj::str(HttpMethod::MKACTIVITY) == \"MKACTIVITY\"");
  }
  name_18.content.size_ = 0xb;
  name_18.content.ptr = "MKACTIVITY";
  tryParseHttpMethod((kj *)&local_38,name_18);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x13) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MKACTIVITY\"",
                 (char (*) [51])"failed: expected *parsed == HttpMethod::MKACTIVITY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MKACTIVITY\" \"\\\" as HttpMethod\"",
               (char (*) [42])"couldn\'t parse \"MKACTIVITY\" as HttpMethod");
  }
  local_3c = CHECKOUT;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "CHECKOUT";
  local_20.content.size_ = 9;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::CHECKOUT) == \\\"CHECKOUT\\\"\"",
               (char (*) [61])"failed: expected kj::str(HttpMethod::CHECKOUT) == \"CHECKOUT\"");
  }
  name_19.content.size_ = 9;
  name_19.content.ptr = "CHECKOUT";
  tryParseHttpMethod((kj *)&local_38,name_19);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x14) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::CHECKOUT\"",
                 (char (*) [49])"failed: expected *parsed == HttpMethod::CHECKOUT");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"CHECKOUT\" \"\\\" as HttpMethod\"",
               (char (*) [40])"couldn\'t parse \"CHECKOUT\" as HttpMethod");
  }
  local_3c = MERGE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "MERGE";
  local_20.content.size_ = 6;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::MERGE) == \\\"MERGE\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpMethod::MERGE) == \"MERGE\"");
  }
  name_20.content.size_ = 6;
  name_20.content.ptr = "MERGE";
  tryParseHttpMethod((kj *)&local_38,name_20);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x15) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MERGE\"",
                 (char (*) [46])"failed: expected *parsed == HttpMethod::MERGE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MERGE\" \"\\\" as HttpMethod\"",
               (char (*) [37])"couldn\'t parse \"MERGE\" as HttpMethod");
  }
  local_3c = MSEARCH;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "MSEARCH";
  local_20.content.size_ = 8;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::MSEARCH) == \\\"MSEARCH\\\"\"",
               (char (*) [59])"failed: expected kj::str(HttpMethod::MSEARCH) == \"MSEARCH\"");
  }
  name_21.content.size_ = 8;
  name_21.content.ptr = "MSEARCH";
  tryParseHttpMethod((kj *)&local_38,name_21);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x16) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::MSEARCH\"",
                 (char (*) [48])"failed: expected *parsed == HttpMethod::MSEARCH");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"MSEARCH\" \"\\\" as HttpMethod\"",
               (char (*) [39])"couldn\'t parse \"MSEARCH\" as HttpMethod");
  }
  local_3c = NOTIFY;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "NOTIFY";
  local_20.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"kj::str(HttpMethod::NOTIFY) == \\\"NOTIFY\\\"\""
               ,(char (*) [57])"failed: expected kj::str(HttpMethod::NOTIFY) == \"NOTIFY\"");
  }
  name_22.content.size_ = 7;
  name_22.content.ptr = "NOTIFY";
  tryParseHttpMethod((kj *)&local_38,name_22);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x17) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::NOTIFY\"",
                 (char (*) [47])"failed: expected *parsed == HttpMethod::NOTIFY");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"NOTIFY\" \"\\\" as HttpMethod\"",
               (char (*) [38])"couldn\'t parse \"NOTIFY\" as HttpMethod");
  }
  local_3c = SUBSCRIBE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "SUBSCRIBE";
  local_20.content.size_ = 10;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::SUBSCRIBE) == \\\"SUBSCRIBE\\\"\"",
               (char (*) [63])"failed: expected kj::str(HttpMethod::SUBSCRIBE) == \"SUBSCRIBE\"");
  }
  name_23.content.size_ = 10;
  name_23.content.ptr = "SUBSCRIBE";
  tryParseHttpMethod((kj *)&local_38,name_23);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x18) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::SUBSCRIBE\"",
                 (char (*) [50])"failed: expected *parsed == HttpMethod::SUBSCRIBE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"SUBSCRIBE\" \"\\\" as HttpMethod\"",
               (char (*) [41])"couldn\'t parse \"SUBSCRIBE\" as HttpMethod");
  }
  local_3c = UNSUBSCRIBE;
  str<kj::HttpMethod>((String *)&local_38,&local_3c);
  local_20.content.ptr = "UNSUBSCRIBE";
  local_20.content.size_ = 0xc;
  bVar1 = String::operator==((String *)&local_38,&local_20);
  Array<char>::~Array(&local_38);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,
               "\"failed: expected \" \"kj::str(HttpMethod::UNSUBSCRIBE) == \\\"UNSUBSCRIBE\\\"\"",
               (char (*) [67])"failed: expected kj::str(HttpMethod::UNSUBSCRIBE) == \"UNSUBSCRIBE\""
              );
  }
  name_24.content.size_ = 0xc;
  name_24.content.ptr = "UNSUBSCRIBE";
  tryParseHttpMethod((kj *)&local_38,name_24);
  if ((char)local_38.ptr == '\x01') {
    if ((local_38.ptr._4_4_ != 0x19) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[52]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x39,ERROR,"\"failed: expected \" \"*parsed == HttpMethod::UNSUBSCRIBE\"",
                 (char (*) [52])"failed: expected *parsed == HttpMethod::UNSUBSCRIBE");
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x39,ERROR,"\"couldn\'t parse \\\"\" \"UNSUBSCRIBE\" \"\\\" as HttpMethod\"",
               (char (*) [43])"couldn\'t parse \"UNSUBSCRIBE\" as HttpMethod");
  }
  name_25.content.size_ = 4;
  name_25.content.ptr = "FOO";
  tryParseHttpMethod((kj *)&local_38,name_25);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3c,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"FOO\\\") == nullptr\"",
               (char (*) [54])"failed: expected tryParseHttpMethod(\"FOO\") == nullptr");
  }
  name_26.content.size_ = 1;
  name_26.content.ptr = "";
  tryParseHttpMethod((kj *)&local_38,name_26);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"\\\") == nullptr\"",
               (char (*) [51])"failed: expected tryParseHttpMethod(\"\") == nullptr");
  }
  name_27.content.size_ = 2;
  name_27.content.ptr = "G";
  tryParseHttpMethod((kj *)&local_38,name_27);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[52]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"G\\\") == nullptr\"",
               (char (*) [52])"failed: expected tryParseHttpMethod(\"G\") == nullptr");
  }
  name_28.content.size_ = 3;
  name_28.content.ptr = "GE";
  tryParseHttpMethod((kj *)&local_38,name_28);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GE\\\") == nullptr\"",
               (char (*) [53])"failed: expected tryParseHttpMethod(\"GE\") == nullptr");
  }
  name_29.content.size_ = 5;
  name_29.content.ptr = "GET ";
  tryParseHttpMethod((kj *)&local_38,name_29);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"GET \\\") == nullptr\"",
               (char (*) [55])"failed: expected tryParseHttpMethod(\"GET \") == nullptr");
  }
  name_30.content.size_ = 4;
  name_30.content.ptr = "get";
  tryParseHttpMethod((kj *)&local_38,name_30);
  if (((char)local_38.ptr == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"tryParseHttpMethod(\\\"get\\\") == nullptr\"",
               (char (*) [54])"failed: expected tryParseHttpMethod(\"get\") == nullptr");
  }
  return;
}

Assistant:

TEST(Async, EvalInt) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<int> promise = evalLater([&]() { done = true; return 123; });
  EXPECT_FALSE(done);
  EXPECT_EQ(123, promise.wait(waitScope));
  EXPECT_TRUE(done);
}